

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int resolve_addr_index(dwarf_sections *dwarf_sections,uint64_t addr_base,int addrsize,
                      int is_bigendian,uint64_t addr_index,backtrace_error_callback error_callback,
                      void *data,uintptr_t *address)

{
  bool bVar1;
  uint64_t uVar2;
  undefined1 local_80 [8];
  dwarf_buf addr_buf;
  uint64_t offset;
  backtrace_error_callback error_callback_local;
  uint64_t addr_index_local;
  int is_bigendian_local;
  int addrsize_local;
  uint64_t addr_base_local;
  dwarf_sections *dwarf_sections_local;
  
  addr_buf._56_8_ = addr_index * (long)addrsize + addr_base;
  bVar1 = (ulong)(addr_buf._56_8_ + (long)addrsize) <= dwarf_sections->size[5];
  if (bVar1) {
    local_80 = (undefined1  [8])0x166fb0;
    addr_buf.name = (char *)dwarf_sections->data[5];
    addr_buf.start = dwarf_sections->data[5] + addr_buf._56_8_;
    addr_buf.buf = (uchar *)(dwarf_sections->size[5] - addr_buf._56_8_);
    addr_buf.error_callback = (backtrace_error_callback)data;
    addr_buf.data._0_4_ = 0;
    addr_buf.left._0_4_ = is_bigendian;
    addr_buf._32_8_ = error_callback;
    uVar2 = read_address((dwarf_buf *)local_80,addrsize);
    *address = uVar2;
  }
  else {
    (*error_callback)(data,"DW_FORM_addrx value out of range",0);
  }
  dwarf_sections_local._4_4_ = (uint)bVar1;
  return dwarf_sections_local._4_4_;
}

Assistant:

static int
resolve_addr_index (const struct dwarf_sections *dwarf_sections,
		    uint64_t addr_base, int addrsize, int is_bigendian,
		    uint64_t addr_index,
		    backtrace_error_callback error_callback, void *data,
		    uintptr_t *address)
{
  uint64_t offset;
  struct dwarf_buf addr_buf;

  offset = addr_index * addrsize + addr_base;
  if (offset + addrsize > dwarf_sections->size[DEBUG_ADDR])
    {
      error_callback (data, "DW_FORM_addrx value out of range", 0);
      return 0;
    }

  addr_buf.name = ".debug_addr";
  addr_buf.start = dwarf_sections->data[DEBUG_ADDR];
  addr_buf.buf = dwarf_sections->data[DEBUG_ADDR] + offset;
  addr_buf.left = dwarf_sections->size[DEBUG_ADDR] - offset;
  addr_buf.is_bigendian = is_bigendian;
  addr_buf.error_callback = error_callback;
  addr_buf.data = data;
  addr_buf.reported_underflow = 0;

  *address = (uintptr_t) read_address (&addr_buf, addrsize);
  return 1;
}